

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRELEASEHOOK sq_getreleasehook(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQObjectPtr *pSVar2;
  SQObjectPtr *ud;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  HSQUIRRELVM in_stack_ffffffffffffffe0;
  _HashNode *local_8;
  
  pSVar2 = stack_get(in_stack_ffffffffffffffe0,
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  SVar1 = (pSVar2->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    local_8 = (_HashNode *)((pSVar2->super_SQObject)._unVal.pClass)->_hook;
  }
  else if (SVar1 == OT_USERDATA) {
    local_8 = ((pSVar2->super_SQObject)._unVal.pTable)->_nodes;
  }
  else if (SVar1 == OT_INSTANCE) {
    local_8 = (_HashNode *)((pSVar2->super_SQObject)._unVal.pTable)->_numofnodes;
  }
  else {
    local_8 = (_HashNode *)0x0;
  }
  return (SQRELEASEHOOK)local_8;
}

Assistant:

SQRELEASEHOOK sq_getreleasehook(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &ud=stack_get(v,idx);
    switch(sq_type(ud) ) {
    case OT_USERDATA:   return _userdata(ud)->_hook;    break;
    case OT_INSTANCE:   return _instance(ud)->_hook;    break;
    case OT_CLASS:      return _class(ud)->_hook;       break;
    default: return NULL;
    }
}